

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* dot(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      *__return_storage_ptr__,
     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
     *theta,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *phi)

{
  double dVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pvVar4;
  int k;
  long lVar5;
  int d;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  allocator_type local_59;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_40;
  value_type_conflict local_38;
  
  local_48 = ((long)(theta->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(theta->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  pvVar2 = (phi->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_50 = ((long)(phi->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
  uVar6 = (long)*(pointer *)
                 ((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + 8) -
          *(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data >> 3;
  local_40 = theta;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,local_48 & 0xffffffff,&local_59);
  lVar5 = 0;
  uVar7 = 0;
  local_58 = uVar6;
  while( true ) {
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(__return_storage_ptr__->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18) <= uVar7)
    break;
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar5),uVar6 & 0xffffffff,&local_38);
    uVar7 = uVar7 + 1;
    lVar5 = lVar5 + 0x18;
  }
  for (uVar6 = 0; uVar6 != (local_48 & 0xffffffff); uVar6 = uVar6 + 1) {
    pvVar3 = (local_40->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar7 != (local_50 & 0xffffffff); uVar7 = uVar7 + 1) {
      dVar1 = *(double *)
               (*(long *)&pvVar3[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data + uVar7 * 8);
      pvVar4 = (phi->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (uVar8 = 0; (local_58 & 0xffffffff) != uVar8; uVar8 = uVar8 + 1) {
        lVar5 = *(long *)&pvVar2[uVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        *(double *)(lVar5 + uVar8 * 8) =
             *(double *)
              (*(long *)&pvVar4[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data + uVar8 * 8) * dVar1 +
             *(double *)(lVar5 + uVar8 * 8);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double> > dot(const vector<vector<double> > &theta, const vector<vector<double> > &phi){
    unsigned int D=theta.size(), K=phi.size(), V=phi[0].size();
    vector<vector<double> > ret(D);
    for(int d=0; d<ret.size(); d++)ret[d].assign(V,0);
    for(int d=0; d<D; d++){
        for(int k=0; k<K; k++){
            double thetadk = theta[d][k];
            for(int v=0; v<V; v++){
                ret[d][v] += thetadk * phi[k][v];
            }
        }
    }
    return ret;
}